

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_allow_multiple(void)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  FILE *__stream;
  ulong uVar6;
  char *pcVar7;
  int32_t one;
  bson_t bson;
  bson_error_t error;
  uint local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_2b0 [648];
  
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_380 = 0x500000003;
  uStack_378 = 5;
  lVar3 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0,0);
  lVar4 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1,0);
  if (lVar3 == 0) {
    pcVar7 = "reader";
    uVar5 = 0x33;
  }
  else {
    if (lVar4 != 0) {
      iVar1 = bson_json_reader_read(lVar3,&local_380,local_2b0);
      __stream = _stderr;
      if (iVar1 == 1) {
        uVar5 = bson_bcone_magic();
        bcon_extract(&local_380,"a",uVar5,0xf,&local_384,0);
        uVar6 = (ulong)local_384;
        if (local_384 == 1) {
          bson_reinit(&local_380);
          iVar1 = bson_json_reader_read(lVar3,&local_380,local_2b0);
          __stream = _stderr;
          if (iVar1 == 1) {
            bcon_extract(&local_380,"b",uVar5,0xf,&local_384,0);
            uVar6 = (ulong)local_384;
            if (local_384 == 1) {
              bson_reinit(&local_380);
              iVar1 = bson_json_reader_read(lVar3,&local_380,local_2b0);
              __stream = _stderr;
              if (iVar1 == 1) {
                bcon_extract(&local_380,"a",uVar5,0xf,&local_384,0);
                uVar6 = (ulong)local_384;
                if (local_384 == 1) {
                  bson_reinit(&local_380);
                  iVar1 = bson_json_reader_read(lVar4,&local_380,local_2b0);
                  __stream = _stderr;
                  if (iVar1 == 1) {
                    bcon_extract(&local_380,"a",uVar5,0xf,&local_384,0);
                    uVar6 = (ulong)local_384;
                    if (local_384 == 1) {
                      bson_reinit(&local_380);
                      iVar1 = bson_json_reader_read(lVar4,&local_380,local_2b0);
                      __stream = _stderr;
                      if (iVar1 == 1) {
                        bcon_extract(&local_380,"b",uVar5,0xf,&local_384,0);
                        uVar6 = (ulong)local_384;
                        if (local_384 == 1) {
                          bson_reinit(&local_380);
                          iVar1 = bson_json_reader_read(lVar4,&local_380,local_2b0);
                          __stream = _stderr;
                          if (iVar1 == 1) {
                            bcon_extract(&local_380,"a",uVar5,0xf,&local_384,0);
                            uVar6 = (ulong)local_384;
                            if (local_384 == 1) {
                              bson_json_reader_destroy(lVar3);
                              bson_json_reader_destroy(lVar4);
                              bson_destroy(&local_380);
                              return;
                            }
                            uVar5 = 0x5c;
                            __stream = _stderr;
                          }
                          else {
                            uVar2 = bson_json_reader_read(lVar4,&local_380,local_2b0);
                            uVar6 = (ulong)uVar2;
                            uVar5 = 0x5a;
                          }
                        }
                        else {
                          uVar5 = 0x55;
                          __stream = _stderr;
                        }
                      }
                      else {
                        uVar2 = bson_json_reader_read(lVar4,&local_380,local_2b0);
                        uVar6 = (ulong)uVar2;
                        uVar5 = 0x53;
                      }
                    }
                    else {
                      uVar5 = 0x4e;
                      __stream = _stderr;
                    }
                  }
                  else {
                    uVar2 = bson_json_reader_read(lVar4,&local_380,local_2b0);
                    uVar6 = (ulong)uVar2;
                    uVar5 = 0x4c;
                  }
                }
                else {
                  uVar5 = 0x46;
                  __stream = _stderr;
                }
              }
              else {
                uVar2 = bson_json_reader_read(lVar3,&local_380,local_2b0);
                uVar6 = (ulong)uVar2;
                uVar5 = 0x44;
              }
            }
            else {
              uVar5 = 0x40;
              __stream = _stderr;
            }
          }
          else {
            uVar2 = bson_json_reader_read(lVar3,&local_380,local_2b0);
            uVar6 = (ulong)uVar2;
            uVar5 = 0x3e;
          }
        }
        else {
          uVar5 = 0x3a;
          __stream = _stderr;
        }
      }
      else {
        uVar2 = bson_json_reader_read(lVar3,&local_380,local_2b0);
        uVar6 = (ulong)uVar2;
        uVar5 = 0x38;
      }
      fprintf(__stream,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",uVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,uVar5,"test_bson_json_allow_multiple");
      abort();
    }
    pcVar7 = "reader_multiple";
    uVar5 = 0x34;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar5,"test_bson_json_allow_multiple",pcVar7);
  abort();
}

Assistant:

static void
test_bson_json_allow_multiple (void)
{
   int32_t one;
   bson_error_t error;
   bson_json_reader_t *reader;
   bson_json_reader_t *reader_multiple;
   bson_t bson = BSON_INITIALIZER;
   bool allow_multiple = true;
   char *multiple_json = "{\"a\": 1}{\"b\": 1}";

   reader = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, !allow_multiple, 0);
   reader_multiple = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, allow_multiple, 0);
   BSON_ASSERT (reader);
   BSON_ASSERT (reader_multiple);

   /* reader with allow_multiple false */
   /* read first json */
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* reader_multiple with allow_multiple true */
   /* read first json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   bson_json_reader_destroy (reader);
   bson_json_reader_destroy (reader_multiple);
   bson_destroy (&bson);
}